

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.h
# Opt level: O1

void __thiscall Layer::Layer(Layer *this,int nodes,int nextNodes)

{
  VectorXf *pVVar1;
  long lVar2;
  char *__function;
  Index dstRows;
  long lVar3;
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  ActualDstType actualDst_3;
  ActualDstType actualDst_1;
  assign_op<float,_float> local_59;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  local_58;
  VectorXf *local_40;
  MatrixXf *local_38;
  
  this->size = nodes;
  this->nextSize = nextNodes;
  local_58.m_rows.m_value = (long)nextNodes;
  local_58.m_cols.m_value = (long)nodes;
  local_58.m_functor.m_other = 0.0;
  if (-1 < (nextNodes | nodes)) {
    local_38 = &this->weights;
    (local_38->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data =
         (float *)0x0;
    (this->weights).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = 0;
    (this->weights).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
              (local_38,&local_58,&local_59);
    local_58.m_rows.m_value = (long)this->nextSize;
    local_58.m_cols.m_value = (long)this->size;
    local_58.m_functor.m_other = 0.0;
    if (-1 < (this->size | this->nextSize)) {
      (this->weightGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (float *)0x0;
      (this->weightGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = 0;
      (this->weightGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = 0;
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                (&this->weightGrads,&local_58,&local_59);
      lVar3 = (long)this->size;
      if (-1 < lVar3) {
        pVVar1 = &this->bias;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             (float *)0x0;
        (this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             = 0;
        local_40 = pVVar1;
        if ((this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != lVar3) {
          Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<float,__1,__1,_1,_0> *)pVVar1,lVar3,lVar3,1);
        }
        lVar2 = (this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows;
        if (lVar2 != lVar3) goto LAB_001067b6;
        if (0 < lVar2) {
          memset((pVVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data,0,lVar2 << 2);
        }
        lVar3 = (long)this->size;
        if (-1 < lVar3) {
          pVVar1 = &this->biasGrads;
          (pVVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data =
               (float *)0x0;
          (this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
          if ((this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != lVar3) {
            Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<float,__1,__1,_1,_0> *)pVVar1,lVar3,lVar3,1);
          }
          lVar2 = (this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          if (lVar2 != lVar3) goto LAB_001067b6;
          if (0 < lVar2) {
            memset((pVVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage
                   .m_data,0,lVar2 << 2);
          }
          lVar3 = (long)this->size;
          if (-1 < lVar3) {
            pVVar1 = &this->output;
            (pVVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
                 = (float *)0x0;
            (this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = 0;
            if ((this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != lVar3) {
              Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                        ((DenseStorage<float,__1,__1,_1,_0> *)pVVar1,lVar3,lVar3,1);
            }
            lVar2 = (this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
            if (lVar2 != lVar3) {
LAB_001067b6:
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>, T1 = float, T2 = float]"
                           );
            }
            if (0 < lVar2) {
              memset((pVVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data,0,lVar2 << 2);
            }
            lVar3 = (long)this->size;
            if (-1 < lVar3) {
              (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (float *)0x0;
              (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = 0;
              if ((this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows != lVar3) {
                Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                          ((DenseStorage<float,__1,__1,_1,_0> *)&this->loss,lVar3,lVar3,1);
              }
              lVar2 = (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
              if (lVar2 == lVar3) {
                if (0 < lVar2) {
                  memset((this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data,0,lVar2 << 2);
                }
                return;
              }
              goto LAB_001067b6;
            }
          }
        }
      }
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
      ;
      goto LAB_001067ea;
    }
  }
  local_58.m_functor.m_other = 0.0;
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
  ;
LAB_001067ea:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

Layer(int nodes, int nextNodes)
        : size(nodes), nextSize(nextNodes), weights(Eigen::MatrixXf::Zero(nextSize, nodes)),
          weightGrads(Eigen::MatrixXf::Zero(nextSize, size)), bias(Eigen::VectorXf::Zero(size)),
          biasGrads(Eigen::VectorXf::Zero(size)), output(Eigen::VectorXf::Zero(size)),
          loss(Eigen::VectorXf::Zero(size)){}